

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiWindow::ImGuiWindow(ImGuiWindow *this,ImGuiContext *context,char *name)

{
  ImVec2 IVar1;
  ImU32 IVar2;
  ImGuiID IVar3;
  char *pcVar4;
  
  (this->SizeContents).x = 0.0;
  (this->SizeContents).y = 0.0;
  (this->SizeContentsExplicit).x = 0.0;
  (this->SizeContentsExplicit).y = 0.0;
  (this->SizeFull).x = 0.0;
  (this->SizeFull).y = 0.0;
  (this->SizeFullAtLastBegin).x = 0.0;
  (this->SizeFullAtLastBegin).y = 0.0;
  (this->WindowPadding).x = 0.0;
  (this->WindowPadding).y = 0.0;
  (this->Pos).x = 0.0;
  (this->Pos).y = 0.0;
  (this->Size).x = 0.0;
  (this->Size).y = 0.0;
  (this->Scroll).x = 0.0;
  (this->Scroll).y = 0.0;
  (this->ScrollTarget).x = 0.0;
  (this->ScrollTarget).y = 0.0;
  (this->ScrollTargetCenterRatio).x = 0.0;
  (this->ScrollTargetCenterRatio).y = 0.0;
  (this->ScrollbarSizes).x = 0.0;
  (this->ScrollbarSizes).y = 0.0;
  (this->SetWindowPosVal).x = 0.0;
  (this->SetWindowPosVal).y = 0.0;
  (this->SetWindowPosPivot).x = 0.0;
  (this->SetWindowPosPivot).y = 0.0;
  ImGuiWindowTempData::ImGuiWindowTempData(&this->DC);
  (this->IDStack).Size = 0;
  (this->IDStack).Capacity = 0;
  (this->IDStack).Data = (uint *)0x0;
  (this->ClipRect).Min.x = 3.4028235e+38;
  (this->ClipRect).Min.y = 3.4028235e+38;
  (this->ClipRect).Max.x = -3.4028235e+38;
  (this->ClipRect).Max.y = -3.4028235e+38;
  (this->OuterRectClipped).Min.x = 3.4028235e+38;
  (this->OuterRectClipped).Min.y = 3.4028235e+38;
  (this->OuterRectClipped).Max.x = -3.4028235e+38;
  (this->OuterRectClipped).Max.y = -3.4028235e+38;
  (this->InnerMainRect).Min.x = 3.4028235e+38;
  (this->InnerMainRect).Min.y = 3.4028235e+38;
  (this->InnerMainRect).Max.x = -3.4028235e+38;
  (this->InnerMainRect).Max.y = -3.4028235e+38;
  (this->InnerClipRect).Min.x = 3.4028235e+38;
  (this->InnerClipRect).Min.y = 3.4028235e+38;
  (this->InnerClipRect).Max.x = -3.4028235e+38;
  (this->InnerClipRect).Max.y = -3.4028235e+38;
  (this->ContentsRegionRect).Min.x = 3.4028235e+38;
  (this->ContentsRegionRect).Min.y = 3.4028235e+38;
  (this->ContentsRegionRect).Max.x = -3.4028235e+38;
  (this->ContentsRegionRect).Max.y = -3.4028235e+38;
  (this->MenuColumns).Count = 0;
  (this->MenuColumns).Spacing = 0.0;
  (this->MenuColumns).Width = 0.0;
  (this->MenuColumns).NextWidth = 0.0;
  (this->MenuColumns).Pos[0] = 0.0;
  (this->MenuColumns).Pos[1] = 0.0;
  (this->MenuColumns).Pos[2] = 0.0;
  (this->MenuColumns).Pos[3] = 0.0;
  (this->MenuColumns).NextWidths[0] = 0.0;
  (this->MenuColumns).NextWidths[1] = 0.0;
  (this->MenuColumns).NextWidths[2] = 0.0;
  (this->MenuColumns).NextWidths[3] = 0.0;
  (this->StateStorage).Data.Size = 0;
  (this->StateStorage).Data.Capacity = 0;
  (this->StateStorage).Data.Data = (Pair *)0x0;
  (this->ColumnsStorage).Size = 0;
  (this->ColumnsStorage).Capacity = 0;
  (this->ColumnsStorage).Data = (ImGuiColumnsSet *)0x0;
  ImDrawList::ImDrawList(&this->DrawListInst,&context->DrawListSharedData);
  this->NavRectRel[1].Min.x = 3.4028235e+38;
  this->NavRectRel[1].Min.y = 3.4028235e+38;
  this->NavRectRel[1].Max.x = -3.4028235e+38;
  this->NavRectRel[1].Max.y = -3.4028235e+38;
  this->NavRectRel[0].Min.x = 3.4028235e+38;
  this->NavRectRel[0].Min.y = 3.4028235e+38;
  this->NavRectRel[0].Max.x = -3.4028235e+38;
  this->NavRectRel[0].Max.y = -3.4028235e+38;
  pcVar4 = ImStrdup(name);
  this->Name = pcVar4;
  IVar2 = ImHash(name,0,0);
  this->ID = IVar2;
  ImVector<unsigned_int>::push_back(&this->IDStack,&this->ID);
  (this->Size).x = 0.0;
  (this->Size).y = 0.0;
  (this->SizeFull).x = 0.0;
  (this->SizeFull).y = 0.0;
  this->Flags = 0;
  (this->Pos).x = 0.0;
  *(undefined8 *)&(this->Pos).y = 0;
  (this->SizeContents).x = 0.0;
  (this->SizeContents).y = 0.0;
  (this->SizeContentsExplicit).x = 0.0;
  (this->SizeContentsExplicit).y = 0.0;
  (this->WindowPadding).x = 0.0;
  (this->WindowPadding).y = 0.0;
  this->WindowRounding = 0.0;
  this->WindowBorderSize = 0.0;
  IVar3 = GetID(this,"#MOVE",(char *)0x0);
  this->MoveId = IVar3;
  this->ChildId = 0;
  (this->Scroll).x = 0.0;
  *(undefined8 *)&(this->Scroll).y = 0x7f7fffff00000000;
  *(undefined8 *)&(this->ScrollTarget).y = 0x3f0000007f7fffff;
  (this->ScrollTargetCenterRatio).y = 0.5;
  (this->ScrollbarSizes).x = 0.0;
  (this->ScrollbarSizes).y = 0.0;
  this->ScrollbarX = false;
  this->ScrollbarY = false;
  this->Active = false;
  this->WasActive = false;
  this->WriteAccessed = false;
  this->Collapsed = false;
  this->CollapseToggleWanted = false;
  this->SkipItems = false;
  this->Appearing = false;
  this->CloseButton = false;
  this->BeginOrderWithinParent = -1;
  this->BeginOrderWithinContext = -1;
  this->BeginCount = 0;
  this->PopupId = 0;
  this->AutoFitFramesX = -1;
  this->AutoFitFramesY = -1;
  this->AutoFitOnlyGrows = false;
  this->AutoFitChildAxises = 0;
  this->AutoPosLastDirection = -1;
  this->HiddenFrames = 0;
  this->SetWindowPosAllowFlags = 0xf;
  (this->SetWindowPosPivot).x = 3.4028235e+38;
  (this->SetWindowPosPivot).y = 3.4028235e+38;
  this->SetWindowSizeAllowFlags = 0xf;
  this->SetWindowCollapsedAllowFlags = 0xf;
  (this->SetWindowPosVal).x = 3.4028235e+38;
  (this->SetWindowPosVal).y = 3.4028235e+38;
  this->LastFrameActive = -1;
  this->ItemWidthDefault = 0.0;
  this->FontWindowScale = 1.0;
  this->DrawList = &this->DrawListInst;
  (this->DrawListInst)._OwnerName = this->Name;
  this->NavLastIds[1] = 0;
  this->NavLastIds[0] = 0;
  this->RootWindowForTitleBarHighlight = (ImGuiWindow *)0x0;
  this->RootWindowForTabbing = (ImGuiWindow *)0x0;
  this->ParentWindow = (ImGuiWindow *)0x0;
  this->RootWindow = (ImGuiWindow *)0x0;
  this->RootWindowForNav = (ImGuiWindow *)0x0;
  this->NavLastChildNavWindow = (ImGuiWindow *)0x0;
  this->NavRectRel[1].Min.x = 3.4028235e+38;
  this->NavRectRel[1].Min.y = 3.4028235e+38;
  this->NavRectRel[1].Max.x = -3.4028235e+38;
  this->NavRectRel[1].Max.y = -3.4028235e+38;
  IVar1 = this->NavRectRel[1].Max;
  this->NavRectRel[0].Min = this->NavRectRel[1].Min;
  this->NavRectRel[0].Max = IVar1;
  this->FocusIdxAllCounter = -1;
  this->FocusIdxTabCounter = -1;
  this->FocusIdxAllRequestCurrent = 0x7fffffff;
  this->FocusIdxTabRequestCurrent = 0x7fffffff;
  this->FocusIdxAllRequestNext = 0x7fffffff;
  this->FocusIdxTabRequestNext = 0x7fffffff;
  return;
}

Assistant:

ImGuiWindow::ImGuiWindow(ImGuiContext* context, const char* name)
    : DrawListInst(&context->DrawListSharedData)
{
    Name = ImStrdup(name);
    ID = ImHash(name, 0);
    IDStack.push_back(ID);
    Flags = 0;
    Pos = ImVec2(0.0f, 0.0f);
    Size = SizeFull = ImVec2(0.0f, 0.0f);
    SizeContents = SizeContentsExplicit = ImVec2(0.0f, 0.0f);
    WindowPadding = ImVec2(0.0f, 0.0f);
    WindowRounding = 0.0f;
    WindowBorderSize = 0.0f;
    MoveId = GetID("#MOVE");
    ChildId = 0;
    Scroll = ImVec2(0.0f, 0.0f);
    ScrollTarget = ImVec2(FLT_MAX, FLT_MAX);
    ScrollTargetCenterRatio = ImVec2(0.5f, 0.5f);
    ScrollbarSizes = ImVec2(0.0f, 0.0f);
    ScrollbarX = ScrollbarY = false;
    Active = WasActive = false;
    WriteAccessed = false;
    Collapsed = false;
    CollapseToggleWanted = false;
    SkipItems = false;
    Appearing = false;
    CloseButton = false;
    BeginOrderWithinParent = -1;
    BeginOrderWithinContext = -1;
    BeginCount = 0;
    PopupId = 0;
    AutoFitFramesX = AutoFitFramesY = -1;
    AutoFitOnlyGrows = false;
    AutoFitChildAxises = 0x00;
    AutoPosLastDirection = ImGuiDir_None;
    HiddenFrames = 0;
    SetWindowPosAllowFlags = SetWindowSizeAllowFlags = SetWindowCollapsedAllowFlags = ImGuiCond_Always | ImGuiCond_Once | ImGuiCond_FirstUseEver | ImGuiCond_Appearing;
    SetWindowPosVal = SetWindowPosPivot = ImVec2(FLT_MAX, FLT_MAX);

    LastFrameActive = -1;
    ItemWidthDefault = 0.0f;
    FontWindowScale = 1.0f;

    DrawList = &DrawListInst;
    DrawList->_OwnerName = Name;
    ParentWindow = NULL;
    RootWindow = NULL;
    RootWindowForTitleBarHighlight = NULL;
    RootWindowForTabbing = NULL;
    RootWindowForNav = NULL;

    NavLastIds[0] = NavLastIds[1] = 0;
    NavRectRel[0] = NavRectRel[1] = ImRect();
    NavLastChildNavWindow = NULL;

    FocusIdxAllCounter = FocusIdxTabCounter = -1;
    FocusIdxAllRequestCurrent = FocusIdxTabRequestCurrent = INT_MAX;
    FocusIdxAllRequestNext = FocusIdxTabRequestNext = INT_MAX;
}